

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

Gia_Man_t * Gia_ManDupMuxesNoHash(Gia_Man_t *p)

{
  int *piVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  uint *puVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  Gia_Obj_t *pGVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  Gia_Obj_t *pGVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *local_70;
  Gia_Obj_t *local_68;
  long local_60;
  Gia_Obj_t *local_58;
  Gia_Man_t *local_50;
  uint local_48;
  uint local_44;
  Gia_Obj_t *local_40;
  Gia_Man_t *local_38;
  
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0xe6,"Gia_Man_t *Gia_ManDupMuxesNoHash(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  iVar5 = p->nObjs;
  if ((0 < iVar5) && (pGVar14 = p->pObjs, pGVar14 != (Gia_Obj_t *)0x0)) {
    lVar24 = 0;
    do {
      if (((~*(uint *)pGVar14 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar14) &&
         (iVar5 = Gia_ObjIsMuxType(pGVar14), iVar5 != 0)) {
        pGVar19 = pGVar14 + -(ulong)((uint)*(undefined8 *)pGVar14 & 0x1fffffff);
        pGVar12 = p->pObjs;
        if ((pGVar19 < pGVar12) || (pGVar12 + p->nObjs <= pGVar19)) goto LAB_007d76a6;
        piVar3 = p->pRefs;
        piVar1 = piVar3 + (int)((ulong)((long)pGVar19 - (long)pGVar12) >> 2) * -0x55555555;
        *piVar1 = *piVar1 + -1;
        pGVar14 = pGVar14 + -(ulong)(*(uint *)&pGVar14->field_0x4 & 0x1fffffff);
        if ((pGVar14 < pGVar12) || (pGVar12 + p->nObjs <= pGVar14)) goto LAB_007d76a6;
        piVar3 = piVar3 + (int)((ulong)((long)pGVar14 - (long)pGVar12) >> 2) * -0x55555555;
        *piVar3 = *piVar3 + -1;
      }
      lVar24 = lVar24 + 1;
      iVar5 = p->nObjs;
    } while ((lVar24 < iVar5) && (pGVar14 = p->pObjs + lVar24, p->pObjs != (Gia_Obj_t *)0x0));
  }
  p_00 = Gia_ManStart(iVar5);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar4);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar4);
  }
  p_00->pName = pcVar9;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar4);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar4);
  }
  p_00->pSpec = pcVar9;
  puVar10 = (uint *)calloc((long)p_00->nObjsAlloc,4);
  p_00->pMuxes = puVar10;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar24 = 0;
    do {
      iVar5 = pVVar11->pArray[lVar24];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_007d76c5;
      pGVar14 = p->pObjs;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar19 = p_00->pObjs;
      if ((pGVar12 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar12)) goto LAB_007d76a6;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar19) >> 2) * -0x55555555);
      pGVar19 = p_00->pObjs;
      if ((pGVar12 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar12)) goto LAB_007d76a6;
      pGVar14[iVar5].Value = (int)((ulong)((long)pGVar12 - (long)pGVar19) >> 2) * 0x55555556;
      lVar24 = lVar24 + 1;
      pVVar11 = p->vCis;
    } while (lVar24 < pVVar11->nSize);
  }
  if (0 < p->nObjs) {
    lVar25 = 0;
    lVar24 = 0;
    local_50 = p_00;
    local_38 = p;
    do {
      pGVar14 = p->pObjs;
      if (pGVar14 == (Gia_Obj_t *)0x0) break;
      if (((~*(uint *)(&pGVar14->field_0x0 + lVar25) & 0x1fffffff) != 0 &&
           -1 < (int)*(uint *)(&pGVar14->field_0x0 + lVar25)) && (p->pRefs[lVar24] != 0)) {
        pGVar19 = (Gia_Obj_t *)(&pGVar14->field_0x0 + lVar25);
        local_60 = lVar24;
        iVar5 = Gia_ObjIsMuxType(pGVar19);
        p_00 = local_50;
        local_68 = pGVar14;
        if (iVar5 == 0) {
          uVar13 = *(ulong *)(&pGVar14->field_0x0 + lVar25);
          uVar18 = *(uint *)((long)pGVar19 + (ulong)(((uint)uVar13 & 0x1fffffff) << 2) * -3 + 8);
          if (((int)uVar18 < 0) ||
             (uVar6 = *(uint *)((long)pGVar14 +
                               lVar25 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3 + 8),
             (int)uVar6 < 0)) goto LAB_007d76e4;
          pGVar14 = Gia_ManAppendObj(local_50);
          p = local_38;
          uVar22 = uVar18 >> 1;
          iVar5 = p_00->nObjs;
          if (iVar5 <= (int)uVar22) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar21 = uVar6 >> 1;
          if (iVar5 <= (int)uVar21) {
            __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          if ((uVar22 == uVar21) && (p_00->fGiaSimple == 0)) {
            __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2ab,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
          }
          uVar18 = (uint)(uVar13 >> 0x1d) & 1 ^ uVar18;
          uVar6 = uVar6 ^ (uint)(uVar13 >> 0x3d) & 1;
          iVar7 = (int)pGVar14;
          if ((int)uVar18 < (int)uVar6) {
            pGVar19 = p_00->pObjs;
            if ((pGVar14 < pGVar19) || (pGVar19 + iVar5 <= pGVar14)) goto LAB_007d76a6;
            uVar13 = *(ulong *)pGVar14;
            uVar15 = (ulong)((uVar18 & 1) << 0x1d |
                            ((uint)(iVar7 - (int)pGVar19) >> 2) * -0x55555555 - uVar22 & 0x1fffffff)
            ;
            *(ulong *)pGVar14 = uVar15 | uVar13 & 0xffffffffc0000000;
            pGVar19 = p_00->pObjs;
            if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
            uVar16 = (ulong)(((uint)(iVar7 - (int)pGVar19) >> 2) * -0x55555555 - uVar21 & 0x1fffffff
                            ) << 0x20;
            *(ulong *)pGVar14 = uVar15 | uVar13 & 0xe0000000c0000000 | uVar16;
            uVar20 = (ulong)(uVar6 & 1) << 0x3d;
            uVar16 = uVar15 | uVar13 & 0xc0000000c0000000 | uVar16;
          }
          else {
            pGVar19 = p_00->pObjs;
            if ((pGVar14 < pGVar19) || (pGVar19 + iVar5 <= pGVar14)) goto LAB_007d76a6;
            uVar23 = (ulong)(((uint)(iVar7 - (int)pGVar19) >> 2) * -0x55555555 - uVar22 & 0x1fffffff
                            ) << 0x20;
            uVar13 = *(ulong *)pGVar14;
            uVar15 = (ulong)(uVar18 & 1) << 0x3d;
            *(ulong *)pGVar14 = uVar15 | uVar13 & 0xc0000000ffffffff | uVar23;
            pGVar19 = p_00->pObjs;
            if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
            uVar16 = (ulong)(((uint)(iVar7 - (int)pGVar19) >> 2) * -0x55555555 - uVar21 & 0x1fffffff
                            );
            *(ulong *)pGVar14 = uVar15 | uVar13 & 0xc0000000e0000000 | uVar23 | uVar16;
            uVar20 = (ulong)((uVar6 & 1) << 0x1d);
            uVar16 = uVar15 | uVar13 & 0xc0000000c0000000 | uVar23 | uVar16;
          }
          *(ulong *)pGVar14 = uVar16 | uVar20;
          if (p_00->pFanData != (int *)0x0) {
            Gia_ObjAddFanout(p_00,pGVar14 + -(uVar16 & 0x1fffffff),pGVar14);
            Gia_ObjAddFanout(p_00,pGVar14 + -((ulong)*(uint *)&pGVar14->field_0x4 & 0x1fffffff),
                             pGVar14);
          }
          if (p_00->fSweeper != 0) {
            uVar15 = *(ulong *)pGVar14 & 0x1fffffff;
            uVar13 = *(ulong *)pGVar14 >> 0x20 & 0x1fffffff;
            uVar23 = 0x4000000000000000;
            if (((uint)*(ulong *)(pGVar14 + -uVar15) >> 0x1e & 1) == 0) {
              uVar23 = 0x40000000;
            }
            *(ulong *)(pGVar14 + -uVar15) = uVar23 | *(ulong *)(pGVar14 + -uVar15);
            uVar23 = *(ulong *)(pGVar14 + -uVar13);
            uVar16 = 0x4000000000000000;
            if (((uint)uVar23 >> 0x1e & 1) == 0) {
              uVar16 = 0x40000000;
            }
            *(ulong *)(pGVar14 + -uVar13) = uVar16 | uVar23;
            uVar13 = *(ulong *)pGVar14;
            *(ulong *)pGVar14 =
                 uVar13 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar13 >> 0x3d) ^ (uint)(uVar23 >> 0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pGVar14 + -uVar15) >> 0x3f) ^
                        (uint)(uVar13 >> 0x1d) & 7)) << 0x3f;
          }
          if (p_00->fBuiltInSim != 0) {
            uVar13 = *(ulong *)pGVar14;
            *(ulong *)pGVar14 =
                 uVar13 & 0x7fffffffffffffff |
                 (ulong)(((uint)(uVar13 >> 0x3d) ^
                         (uint)((ulong)*(undefined8 *)(pGVar14 + -(uVar13 >> 0x20 & 0x1fffffff)) >>
                               0x3f)) &
                        ((uint)((ulong)*(undefined8 *)(pGVar14 + -(uVar13 & 0x1fffffff)) >> 0x3f) ^
                        (uint)(uVar13 >> 0x1d) & 7)) << 0x3f;
            pGVar19 = p_00->pObjs;
            if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
            Gia_ManBuiltInSimPerform
                      (p_00,(int)((ulong)((long)pGVar14 - (long)pGVar19) >> 2) * -0x55555555);
          }
          if (p_00->vSuppWords != (Vec_Wrd_t *)0x0) {
            Gia_ManQuantSetSuppAnd(p_00,pGVar14);
          }
          pGVar19 = p_00->pObjs;
          if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
          uVar18 = (int)((ulong)((long)pGVar14 - (long)pGVar19) >> 2) * 0x55555556;
        }
        else {
          iVar5 = Gia_ObjRecognizeExor(pGVar19,&local_58,&local_70);
          p_00 = local_50;
          if (iVar5 == 0) {
            pGVar19 = Gia_ObjRecognizeMux(pGVar19,&local_70,&local_58);
            p_00 = local_50;
            pGVar12 = (Gia_Obj_t *)((ulong)local_58 & 0xfffffffffffffffe);
            pGVar14 = p->pObjs;
            if (pGVar12 < pGVar14) goto LAB_007d76a6;
            iVar5 = p->nObjs;
            pGVar2 = pGVar14 + iVar5;
            if (pGVar2 <= pGVar12) goto LAB_007d76a6;
            uVar18 = (int)((long)pGVar12 - (long)pGVar14 >> 2) * -0x55555555;
            if ((int)uVar18 < 0) goto LAB_007d7703;
            if (iVar5 <= (int)uVar18) goto LAB_007d76c5;
            uVar6 = pGVar14[uVar18 & 0x7fffffff].Value;
            if ((int)uVar6 < 0) goto LAB_007d76e4;
            pGVar12 = (Gia_Obj_t *)((ulong)local_70 & 0xfffffffffffffffe);
            if ((pGVar12 < pGVar14) || (pGVar2 <= pGVar12)) goto LAB_007d76a6;
            uVar18 = (int)((long)pGVar12 - (long)pGVar14 >> 2) * -0x55555555;
            if ((int)uVar18 < 0) goto LAB_007d7703;
            if (iVar5 <= (int)uVar18) goto LAB_007d76c5;
            uVar22 = pGVar14[uVar18 & 0x7fffffff].Value;
            if ((int)uVar22 < 0) goto LAB_007d76e4;
            uVar18 = (uint)local_58 & 1 ^ uVar6;
            uVar21 = (uint)local_70 & 1 ^ uVar22;
            if (uVar18 != uVar21) {
              local_44 = uVar6 >> 1;
              uVar22 = uVar22 >> 1;
              pGVar12 = (Gia_Obj_t *)((ulong)pGVar19 & 0xfffffffffffffffe);
              if (local_44 == uVar22) {
                if (pGVar2 <= pGVar12 || pGVar12 < pGVar14) goto LAB_007d76a6;
                uVar22 = (int)((long)pGVar12 - (long)pGVar14 >> 2) * -0x55555555;
                if ((int)uVar22 < 0) goto LAB_007d7703;
                if (iVar5 <= (int)uVar22) goto LAB_007d76c5;
                uVar22 = pGVar14[uVar22 & 0x7fffffff].Value;
                if ((int)uVar22 < 0) goto LAB_007d76e4;
                uVar6 = Gia_ManAppendXorReal(local_50,uVar6 & 0x7ffffffe,uVar22 & 0x7ffffffe);
                uVar18 = uVar6 ^ (uVar18 ^ (uint)pGVar19 ^ uVar22) & 1;
              }
              else {
                if (pGVar2 <= pGVar12 || pGVar12 < pGVar14) {
LAB_007d76a6:
                  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar6 = (int)((long)pGVar12 - (long)pGVar14 >> 2) * -0x55555555;
                if ((int)uVar6 < 0) goto LAB_007d7703;
                if (iVar5 <= (int)uVar6) goto LAB_007d76c5;
                uVar6 = pGVar14[uVar6 & 0x7fffffff].Value;
                local_48 = uVar22;
                local_40 = pGVar19;
                if ((int)uVar6 < 0) goto LAB_007d76e4;
                pGVar14 = Gia_ManAppendObj(local_50);
                if (p_00->pMuxes == (uint *)0x0) {
                  __assert_fail("p->pMuxes != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2ee,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                iVar5 = p_00->nObjs;
                if (iVar5 <= (int)local_44) {
                  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2ef,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                if (iVar5 <= (int)local_48) {
                  __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f0,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                uVar22 = uVar6 >> 1;
                if (iVar5 <= (int)uVar22) {
                  __assert_fail("iLitC >= 0 && Abc_Lit2Var(iLitC) < Gia_ManObjNum(p)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f1,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                if (uVar22 == local_44) {
                  __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit0)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f3,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                if (uVar22 == local_48) {
                  __assert_fail("Abc_Lit2Var(iLitC) != Abc_Lit2Var(iLit1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f4,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                uVar21 = uVar21 & 1;
                if ((uVar21 != 0) && ((p_00->vHTable).nSize != 0)) {
                  __assert_fail("!Vec_IntSize(&p->vHTable) || !Abc_LitIsCompl(iLit1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                ,0x2f5,"int Gia_ManAppendMuxReal(Gia_Man_t *, int, int, int)");
                }
                uVar6 = uVar6 ^ (uint)local_40 & 1;
                iVar7 = (int)pGVar14;
                if (local_44 < local_48) {
                  pGVar19 = p_00->pObjs;
                  if ((pGVar14 < pGVar19) || (pGVar19 + iVar5 <= pGVar14)) goto LAB_007d76a6;
                  uVar13 = *(ulong *)pGVar14;
                  uVar15 = (ulong)((uVar18 & 1) << 0x1d |
                                  ((uint)(iVar7 - (int)pGVar19) >> 2) * -0x55555555 - local_44 &
                                  0x1fffffff);
                  *(ulong *)pGVar14 = uVar15 | uVar13 & 0xffffffffc0000000;
                  pGVar19 = p_00->pObjs;
                  if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
                  *(ulong *)pGVar14 =
                       (ulong)uVar21 << 0x3d |
                       (ulong)(((uint)(iVar7 - (int)pGVar19) >> 2) * -0x55555555 - local_48 &
                              0x1fffffff) << 0x20 | uVar15 | uVar13 & 0xc0000000c0000000;
                  pGVar19 = p_00->pObjs;
                  if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
                }
                else {
                  pGVar19 = p_00->pObjs;
                  if ((pGVar14 < pGVar19) || (pGVar19 + iVar5 <= pGVar14)) goto LAB_007d76a6;
                  uVar15 = (ulong)(((uint)(iVar7 - (int)pGVar19) >> 2) * -0x55555555 - local_44 &
                                  0x1fffffff) << 0x20;
                  uVar13 = *(ulong *)pGVar14;
                  uVar23 = (ulong)(uVar18 & 1) << 0x3d;
                  *(ulong *)pGVar14 = uVar23 | uVar13 & 0xc0000000ffffffff | uVar15;
                  pGVar19 = p_00->pObjs;
                  if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
                  *(ulong *)pGVar14 =
                       (ulong)(uVar21 << 0x1d) | uVar23 | uVar13 & 0xc0000000c0000000 | uVar15 |
                       (ulong)(((uint)(iVar7 - (int)pGVar19) >> 2) * -0x55555555 - local_48 &
                              0x1fffffff);
                  pGVar19 = p_00->pObjs;
                  if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
                  uVar6 = uVar6 ^ 1;
                }
                p_00->pMuxes[(int)((ulong)((long)pGVar14 - (long)pGVar19) >> 2) * -0x55555555] =
                     uVar6;
                p_00->nMuxes = p_00->nMuxes + 1;
                pGVar19 = p_00->pObjs;
                if ((pGVar14 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar14)) goto LAB_007d76a6;
                uVar18 = (int)((ulong)((long)pGVar14 - (long)pGVar19) >> 2) * 0x55555556;
              }
            }
          }
          else {
            pGVar19 = (Gia_Obj_t *)((ulong)local_58 & 0xfffffffffffffffe);
            pGVar14 = p->pObjs;
            if (pGVar19 < pGVar14) goto LAB_007d76a6;
            iVar5 = p->nObjs;
            if (pGVar14 + iVar5 <= pGVar19) goto LAB_007d76a6;
            uVar18 = (int)((long)pGVar19 - (long)pGVar14 >> 2) * -0x55555555;
            if ((int)uVar18 < 0) {
LAB_007d7703:
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            if (iVar5 <= (int)uVar18) goto LAB_007d76c5;
            uVar6 = pGVar14[uVar18 & 0x7fffffff].Value;
            if ((int)uVar6 < 0) goto LAB_007d76e4;
            pGVar19 = (Gia_Obj_t *)((ulong)local_70 & 0xfffffffffffffffe);
            if ((pGVar19 < pGVar14) || (pGVar14 + iVar5 <= pGVar19)) goto LAB_007d76a6;
            uVar18 = (int)((long)pGVar19 - (long)pGVar14 >> 2) * -0x55555555;
            if ((int)uVar18 < 0) goto LAB_007d7703;
            if (iVar5 <= (int)uVar18) goto LAB_007d76c5;
            uVar22 = pGVar14[uVar18 & 0x7fffffff].Value;
            if ((int)uVar22 < 0) goto LAB_007d76e4;
            uVar21 = (uint)local_58;
            uVar17 = (uint)local_70;
            uVar18 = Gia_ManAppendXorReal(local_50,uVar6 & 0x7ffffffe,uVar22 & 0x7ffffffe);
            uVar18 = uVar18 ^ (uVar17 ^ uVar21 ^ uVar6 ^ uVar22) & 1;
          }
        }
        *(uint *)((long)&local_68->Value + lVar25) = uVar18;
        lVar24 = local_60;
      }
      lVar24 = lVar24 + 1;
      lVar25 = lVar25 + 0xc;
    } while (lVar24 < p->nObjs);
  }
  pVVar11 = p->vCos;
  if (0 < pVVar11->nSize) {
    lVar24 = 0;
    do {
      iVar5 = pVVar11->pArray[lVar24];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_007d76c5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar14 = p->pObjs + iVar5;
      if ((int)pGVar14[-(ulong)((uint)*(undefined8 *)pGVar14 & 0x1fffffff)].Value < 0) {
LAB_007d76e4:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar18 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar14 >> 0x1d & 1 ^
                                    pGVar14[-(ulong)((uint)*(undefined8 *)pGVar14 & 0x1fffffff)].
                                    Value);
      pGVar14->Value = uVar18;
      lVar24 = lVar24 + 1;
      pVVar11 = p->vCos;
    } while (lVar24 < pVVar11->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  iVar5 = Gia_ManHasDangling(p_00);
  if (iVar5 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x11b,"Gia_Man_t *Gia_ManDupMuxesNoHash(Gia_Man_t *)");
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupMuxesNoHash( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, iLit0, iLit1, fCompl;
    assert( p->pMuxes == NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // discount nodes with one fanout pointed to by MUX type
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        Gia_ObjRefDec(p, Gia_ObjFanin0(pObj));
        Gia_ObjRefDec(p, Gia_ObjFanin1(pObj));
    }
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName  = Abc_UtilStrsav( p->pName );
    pNew->pSpec  = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNumId(p, i) )
            continue;
        if ( !Gia_ObjIsMuxType(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
        {
            iLit0 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0));
            iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1));
            fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
            pObj->Value = fCompl ^ Gia_ManAppendXorReal( pNew, Abc_LitRegular(iLit0), Abc_LitRegular(iLit1) );
        }
        else
        {
            pFanC = Gia_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            iLit0 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0));
            iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1));
            if ( iLit0 == iLit1 )
                pObj->Value = iLit0;
            else if ( Abc_Lit2Var(iLit0) == Abc_Lit2Var(iLit1) )
            {
                iLit1 = Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC));
                fCompl = Abc_LitIsCompl(iLit0) ^ Abc_LitIsCompl(iLit1);
                pObj->Value = fCompl ^ Gia_ManAppendXorReal( pNew, Abc_LitRegular(iLit0), Abc_LitRegular(iLit1) );
            }
            else
                pObj->Value = Gia_ManAppendMuxReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)) );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( !Gia_ManHasDangling(pNew) );
    return pNew;
}